

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
sort_by_function::evaluate
          (sort_by_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  pointer ppVar1;
  expression_type *peVar2;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_danielaparker[P]jsoncons_include_jsoncons_ext_jmespath_jmespath_hpp:2097:21)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_danielaparker[P]jsoncons_include_jsoncons_ext_jmespath_jmespath_hpp:2097:21)>
  __comp_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  size_t sVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  __seed;
  long lVar5;
  reference pbVar6;
  assertion_error *this_01;
  uint uVar7;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  __last;
  array_range_type aVar8;
  string local_50;
  
  ppVar1 = (args->
           super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4 !=
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"assertion \'args.size() == *this->arity()\' failed at  <> :0",""
              );
    assertion_error::assertion_error(this_01,&local_50);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ppVar1->type_ == value) && (ppVar1[1].type_ == expression)) {
    this_00 = (ppVar1->field_1).value_;
    pbVar3 = this_00;
    while (uVar7 = *(byte *)&pbVar3->field_0 & 0xf, uVar7 - 8 < 2) {
      pbVar3 = *(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> **)
                ((long)&pbVar3->field_0 + 8);
    }
    if (uVar7 == 0xe) {
      sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(this_00);
      if (1 < sVar4) {
        peVar2 = (args->
                 super__Vector_base<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start[1].field_1.expression_;
        this_00 = eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                  ::
                  create_json<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
                            ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                              *)context,this_00);
        aVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (this_00);
        __seed._M_current =
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             aVar8.first_._M_current;
        aVar8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                          (this_00);
        __last._M_current =
             (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
             aVar8.last_._M_current;
        if (__seed._M_current != __last._M_current) {
          lVar5 = (long)__last._M_current - (long)__seed._M_current >> 4;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                               *)&local_50,__seed,(lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
          if ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
              local_50.field_2._M_allocated_capacity ==
              (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
            __comp_00._M_comp.context = context;
            __comp_00._M_comp.expr = peVar2;
            __comp_00._M_comp.ec = ec;
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::sort_by_function::evaluate(std::vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>const&,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)const::_lambda(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)_1_>>
                      (__seed,__last,__comp_00);
          }
          else {
            __comp._M_comp.context = context;
            __comp._M_comp.expr = peVar2;
            __comp._M_comp.ec = ec;
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,std::vector<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::sort_by_function::evaluate(std::vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>const&,jsoncons::jmespath::eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>&,std::error_code&)const::_lambda(jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&)_1_>>
                      (__seed,__last,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       local_50.field_2._M_allocated_capacity,local_50._M_string_length,__comp);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&local_50);
        }
        if (ec->_M_value != 0) {
          this_00 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value(context);
        }
      }
      return this_00;
    }
  }
  std::error_code::operator=(ec,invalid_type);
  pbVar6 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar6;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_value() && args[1].is_expression()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.size() <= 1)
                {
                    return arg0;
                }

                const auto& expr = args[1].expression();

                auto v = context.create_json(arg0);
                std::stable_sort((v->array_range()).begin(), (v->array_range()).end(),
                    [&expr,&context,&ec](reference lhs, reference rhs) -> bool
                {
                    std::error_code ec2;
                    reference key1 = expr.evaluate(lhs, context, ec2);
                    bool is_number = key1.is_number();
                    bool is_string = key1.is_string();
                    if (!(is_number || is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                    }

                    reference key2 = expr.evaluate(rhs, context, ec2);
                    if (!(key2.is_number() == is_number && key2.is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                    }
                    
                    return key1 < key2;
                });
                return ec ? context.null_value() : *v;
            }